

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt_utils.h
# Opt level: O0

void set_mode_eval_params(AV1_COMP *cpi,MACROBLOCK *x,MODE_EVAL_TYPE mode_eval_type)

{
  uint uVar1;
  SPEED_FEATURES *sf_00;
  AV1_COMMON *cm_00;
  WinnerModeParams *winner_mode_params_00;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  TxfmSearchParams *txfm_params;
  WinnerModeParams *winner_mode_params;
  SPEED_FEATURES *sf;
  AV1_COMMON *cm;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  
  sf_00 = (SPEED_FEATURES *)(in_RDI + 0x608c0);
  cm_00 = (AV1_COMMON *)(in_RDI + 0x60708);
  winner_mode_params_00 = (WinnerModeParams *)(in_RSI + 0x24dcc);
  *(uint *)(in_RSI + 0x24df8) = (uint)(*(int *)(in_RDI + 0x426a4) == 1);
  uVar1 = (uint)in_DL;
  if (uVar1 == 0) {
    *(undefined4 *)(in_RSI + 0x24dd0) = 0x7fffffff;
    winner_mode_params_00->coeff_opt_thresholds[0][0] = 0;
    *(undefined4 *)(in_RSI + 0x24dec) = *(undefined4 *)(in_RDI + 0x6073c);
    *(undefined4 *)(in_RSI + 0x24df4) = *(undefined4 *)(in_RDI + 0x60748);
    set_tx_domain_dist_params
              ((WinnerModeParams *)cm_00,(TxfmSearchParams *)winner_mode_params_00,0,0);
    get_rd_opt_coeff_thresh((uint32_t (*) [2])cm_00,(TxfmSearchParams *)winner_mode_params_00,0,0);
    set_tx_size_search_method
              (cm_00,winner_mode_params_00,
               (TxfmSearchParams *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    set_tx_type_prune(sf_00,(TxfmSearchParams *)winner_mode_params_00,0,0);
  }
  else if (uVar1 == 1) {
    uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffc0);
    if (*(int *)(in_RDI + 0x60bdc) == 0) {
      uVar2 = CONCAT13(*(undefined1 *)(in_RDI + 0x426f6),(int3)in_stack_ffffffffffffffc0);
    }
    winner_mode_params_00->coeff_opt_thresholds[0][0] = (uint)((byte)((uint)uVar2 >> 0x18) & 1);
    *(undefined4 *)(in_RSI + 0x24dd0) = *(undefined4 *)(in_RDI + 0x60be0);
    *(undefined4 *)(in_RSI + 0x24dec) = *(undefined4 *)(in_RDI + 0x60740);
    *(undefined4 *)(in_RSI + 0x24df4) = *(undefined4 *)(in_RDI + 0x6074c);
    set_tx_domain_dist_params
              ((WinnerModeParams *)cm_00,(TxfmSearchParams *)winner_mode_params_00,
               *(int *)(in_RDI + 0x60c3c),0);
    get_rd_opt_coeff_thresh
              ((uint32_t (*) [2])cm_00,(TxfmSearchParams *)winner_mode_params_00,
               *(int *)(in_RDI + 0x60c30),0);
    set_tx_size_search_method
              (cm_00,winner_mode_params_00,(TxfmSearchParams *)CONCAT44(uVar1,uVar2),
               in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    set_tx_type_prune(sf_00,(TxfmSearchParams *)winner_mode_params_00,*(int *)(in_RDI + 0x60bfc),0);
  }
  else if (uVar1 == 2) {
    *(undefined4 *)(in_RSI + 0x24dd0) = 0x7fffffff;
    winner_mode_params_00->coeff_opt_thresholds[0][0] = 0;
    *(undefined4 *)(in_RSI + 0x24dec) = *(undefined4 *)(in_RDI + 0x60744);
    *(undefined4 *)(in_RSI + 0x24df4) = *(undefined4 *)(in_RDI + 0x60750);
    set_tx_domain_dist_params
              ((WinnerModeParams *)cm_00,(TxfmSearchParams *)winner_mode_params_00,
               *(int *)(in_RDI + 0x60c3c),1);
    get_rd_opt_coeff_thresh
              ((uint32_t (*) [2])cm_00,(TxfmSearchParams *)winner_mode_params_00,
               *(int *)(in_RDI + 0x60c30),1);
    set_tx_size_search_method
              (cm_00,winner_mode_params_00,
               (TxfmSearchParams *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    set_tx_type_prune(sf_00,(TxfmSearchParams *)winner_mode_params_00,*(int *)(in_RDI + 0x60bfc),1);
  }
  if (winner_mode_params_00->tx_domain_dist_threshold[2] != (uint)in_DL) {
    reset_mb_rd_record(*(MB_RD_RECORD **)(in_RSI + 0x25610));
  }
  winner_mode_params_00->tx_domain_dist_threshold[2] = (uint)in_DL;
  return;
}

Assistant:

static inline void set_mode_eval_params(const struct AV1_COMP *cpi,
                                        MACROBLOCK *x,
                                        MODE_EVAL_TYPE mode_eval_type) {
  const AV1_COMMON *cm = &cpi->common;
  const SPEED_FEATURES *sf = &cpi->sf;
  const WinnerModeParams *winner_mode_params = &cpi->winner_mode_params;
  TxfmSearchParams *txfm_params = &x->txfm_search_params;

  txfm_params->use_qm_dist_metric =
      cpi->oxcf.tune_cfg.dist_metric == AOM_DIST_METRIC_QM_PSNR;

  switch (mode_eval_type) {
    case DEFAULT_EVAL:
      txfm_params->default_inter_tx_type_prob_thresh = INT_MAX;
      txfm_params->use_default_intra_tx_type = 0;
      txfm_params->skip_txfm_level =
          winner_mode_params->skip_txfm_level[DEFAULT_EVAL];
      txfm_params->predict_dc_level =
          winner_mode_params->predict_dc_level[DEFAULT_EVAL];
      // Set default transform domain distortion type
      set_tx_domain_dist_params(winner_mode_params, txfm_params, 0, 0);

      // Get default threshold for R-D optimization of coefficients
      get_rd_opt_coeff_thresh(winner_mode_params->coeff_opt_thresholds,
                              txfm_params, 0, 0);

      // Set default transform size search method
      set_tx_size_search_method(cm, winner_mode_params, txfm_params, 0, 0);
      // Set default transform type prune
      set_tx_type_prune(sf, txfm_params, 0, 0);
      break;
    case MODE_EVAL:
      txfm_params->use_default_intra_tx_type =
          (cpi->sf.tx_sf.tx_type_search.fast_intra_tx_type_search ||
           cpi->oxcf.txfm_cfg.use_intra_default_tx_only);
      txfm_params->default_inter_tx_type_prob_thresh =
          cpi->sf.tx_sf.tx_type_search.fast_inter_tx_type_prob_thresh;
      txfm_params->skip_txfm_level =
          winner_mode_params->skip_txfm_level[MODE_EVAL];
      txfm_params->predict_dc_level =
          winner_mode_params->predict_dc_level[MODE_EVAL];
      // Set transform domain distortion type for mode evaluation
      set_tx_domain_dist_params(
          winner_mode_params, txfm_params,
          sf->winner_mode_sf.enable_winner_mode_for_use_tx_domain_dist, 0);

      // Get threshold for R-D optimization of coefficients during mode
      // evaluation
      get_rd_opt_coeff_thresh(
          winner_mode_params->coeff_opt_thresholds, txfm_params,
          sf->winner_mode_sf.enable_winner_mode_for_coeff_opt, 0);

      // Set the transform size search method for mode evaluation
      set_tx_size_search_method(
          cm, winner_mode_params, txfm_params,
          sf->winner_mode_sf.enable_winner_mode_for_tx_size_srch, 0);
      // Set transform type prune for mode evaluation
      set_tx_type_prune(sf, txfm_params,
                        sf->tx_sf.tx_type_search.winner_mode_tx_type_pruning,
                        0);
      break;
    case WINNER_MODE_EVAL:
      txfm_params->default_inter_tx_type_prob_thresh = INT_MAX;
      txfm_params->use_default_intra_tx_type = 0;
      txfm_params->skip_txfm_level =
          winner_mode_params->skip_txfm_level[WINNER_MODE_EVAL];
      txfm_params->predict_dc_level =
          winner_mode_params->predict_dc_level[WINNER_MODE_EVAL];

      // Set transform domain distortion type for winner mode evaluation
      set_tx_domain_dist_params(
          winner_mode_params, txfm_params,
          sf->winner_mode_sf.enable_winner_mode_for_use_tx_domain_dist, 1);

      // Get threshold for R-D optimization of coefficients for winner mode
      // evaluation
      get_rd_opt_coeff_thresh(
          winner_mode_params->coeff_opt_thresholds, txfm_params,
          sf->winner_mode_sf.enable_winner_mode_for_coeff_opt, 1);

      // Set the transform size search method for winner mode evaluation
      set_tx_size_search_method(
          cm, winner_mode_params, txfm_params,
          sf->winner_mode_sf.enable_winner_mode_for_tx_size_srch, 1);
      // Set default transform type prune mode for winner mode evaluation
      set_tx_type_prune(sf, txfm_params,
                        sf->tx_sf.tx_type_search.winner_mode_tx_type_pruning,
                        1);
      break;
    default: assert(0);
  }

  // Rd record collected at a specific mode evaluation stage can not be used
  // across other evaluation stages as the transform parameters are different.
  // Hence, reset mb rd record whenever mode evaluation stage type changes.
  if (txfm_params->mode_eval_type != mode_eval_type)
    reset_mb_rd_record(x->txfm_search_info.mb_rd_record);

  txfm_params->mode_eval_type = mode_eval_type;
}